

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O2

void __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::make_fa
          (StronglyRegularToFA<covenant::Sym> *this,State q_0,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *alpha,State q_1,
          SymStateMap *SymToState)

{
  Sym SVar1;
  pointer pSVar2;
  pointer pvVar3;
  long lVar4;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  __first;
  pointer pSVar5;
  bool bVar6;
  State SVar7;
  State SVar8;
  State SVar9;
  size_type sVar10;
  ostream *poVar11;
  ulong uVar12;
  node_pointer ppVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> *p_Var15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  allocator local_229;
  State local_228;
  State local_224;
  SymStateMap *local_220;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> GroupSyms;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS_1;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_198;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_180;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_168;
  _Vector_base<int,_std::allocator<int>_> local_150;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_138;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_120;
  _Vector_base<int,_std::allocator<int>_> local_108;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_f0;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_d8;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_c0;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_a8;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_90;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_78;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_60;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  local_228.id = q_0.id;
  local_224.id = q_1.id;
  local_220 = SymToState;
  if (avy::AvyLogFlag == 1) {
    std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
    sVar10 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
    std::__cxx11::string::~string((string *)&RHS);
    if (sVar10 != 0) {
      poVar11 = std::operator<<((ostream *)&std::cout,"reading word ");
      poVar11 = operator<<(poVar11,alpha);
      poVar11 = std::operator<<(poVar11," with size ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
  }
  pSVar2 = (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar2 >> 2;
  if (uVar12 == 1) {
    if ((pSVar2->x & 1) == 0) {
      if ((avy::AvyLogFlag & 1) != 0) {
        std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
        std::__cxx11::string::~string((string *)&RHS);
        if (sVar10 != 0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"[make_fa] (case A->a) reading ");
          poVar11 = operator<<(poVar11,alpha);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
      }
      DFA<covenant::Sym>::transition
                (&this->dfa,local_228,
                 (alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
                 super__Vector_impl_data._M_start,local_224);
      return;
    }
LAB_00160c29:
    if ((avy::AvyLogFlag & 1) != 0) {
      std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
      sVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
      std::__cxx11::string::~string((string *)&RHS);
      if (sVar10 != 0) {
        poVar11 = std::operator<<((ostream *)&std::cout,"[make_fa] (case A->B) reading ");
        poVar11 = operator<<(poVar11,alpha);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    SVar1.x = ((alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start)->x;
    iVar16 = SVar1.x >> 1;
    RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar16;
    ppVar13 = boost::unordered::detail::
              table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              ::find_node(&(this->sym_scc_map).table_,(const_key_type *)&RHS);
    if ((this->recursive).
        super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>.
        _M_impl.super__Vector_impl_data._M_start
        [*(uint *)((long)&(ppVar13->value_base_).data_.data_ + 4)] == NON_REC) {
      if (avy::AvyLogFlag == 1) {
        std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
        std::__cxx11::string::~string((string *)&RHS);
        if (sVar10 != 0) {
          std::operator<<((ostream *)&std::cout,"[make_fa] A is not recursive\n ");
        }
      }
      uVar17 = 0;
      while( true ) {
        pvVar3 = (this->g).prods.
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = *(long *)&pvVar3[iVar16].
                          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar3[iVar16].
                                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 2) <=
            (ulong)uVar17) break;
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   &RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>,
                   (this->g).rules.
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar4 + (ulong)uVar17 * 4));
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_48,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                   &RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
        make_fa(this,local_228,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_48,
                local_224,local_220);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_48);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                  (&RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
        uVar17 = uVar17 + 1;
      }
      return;
    }
    SVar7 = MapSymToState(this,local_220,SVar1);
    if ((this->recursive).
        super__Vector_base<covenant::RecursiveType,_std::allocator<covenant::RecursiveType>_>.
        _M_impl.super__Vector_impl_data._M_start
        [*(uint *)((long)&(ppVar13->value_base_).data_.data_ + 4)] == LEFT) {
      if (avy::AvyLogFlag != 0) {
        std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
        std::__cxx11::string::~string((string *)&RHS);
        if (sVar10 != 0) {
          std::operator<<((ostream *)&std::cout,"[make_fa] A is marked as LEFT\n");
        }
      }
      pvVar14 = CFGConnect::group(&this->conn,
                                  *(int *)((long)&(ppVar13->value_base_).data_.data_ + 4));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_108,pvVar14);
      convert_ints_to_symbols(&RHS,this,(vector<int,_std::allocator<int>_> *)&local_108);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
      uVar17 = 0;
      while( true ) {
        if ((ulong)((long)RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    CONCAT44(RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)RHS.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) <= (ulong)uVar17)
        break;
        SVar1.x = *(int *)(CONCAT44(RHS.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)RHS.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_start) +
                          (ulong)uVar17 * 4);
        SVar8 = MapSymToState(this,local_220,SVar1);
        iVar16 = SVar1.x >> 1;
        uVar18 = 0;
        while( true ) {
          pvVar3 = (this->g).prods.
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = *(long *)&pvVar3[iVar16].
                            super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                            ._M_impl.super__Vector_impl_data;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar3[iVar16].
                                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                     ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 2) <=
              (ulong)uVar18) break;
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     &GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>,
                     (this->g).rules.
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar4 + (ulong)uVar18 * 4)
                    );
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_120,
                     (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     &GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_60,&RHS);
          bVar6 = intersect_unorder_ord<covenant::Sym>
                            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_120,
                             (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_60);
          std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_60)
          ;
          std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                    (&local_120);
          if (bVar6) {
            __first._M_current._4_4_ =
                 RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            __first._M_current._0_4_ =
                 (int)RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                      super__Vector_impl_data._M_start;
            bVar6 = std::
                    binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                              (__first,(__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                                        )RHS.
                                         super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                               GroupSyms.
                               super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            pSVar5 = GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pSVar2 = GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (bVar6) {
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_78,&RHS);
              bVar6 = intersect_unorder_ord<covenant::Sym>
                                (pSVar2 + 1,(iterator)pSVar5,
                                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_78)
              ;
              std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                        (&local_78);
              if (!bVar6) {
                SVar1 = (Sym)(GroupSyms.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start)->x;
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          (&RHS_1,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                  &GroupSyms.
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          );
                remove<covenant::Sym>(&RHS_1,0);
                SVar9 = MapSymToState(this,local_220,SVar1);
                std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_90,&RHS_1
                          );
                make_fa(this,SVar9,
                        (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_90,SVar8,
                        local_220);
                std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                          (&local_90);
                p_Var15 = &RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>;
                goto LAB_001613c2;
              }
            }
          }
          else {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_138,
                       (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                       &GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)
            ;
            p_Var15 = &local_138;
            make_fa(this,local_228,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)p_Var15,
                    SVar8,local_220);
LAB_001613c2:
            std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(p_Var15)
            ;
          }
          std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                    (&GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
          uVar18 = uVar18 + 1;
        }
        uVar17 = uVar17 + 1;
      }
      DFA<covenant::Sym>::eps_transition(&this->dfa,SVar7,local_224);
      p_Var15 = &RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>;
      goto LAB_00161122;
    }
    if (avy::AvyLogFlag != 0) {
      std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
      sVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
      std::__cxx11::string::~string((string *)&RHS);
      if (sVar10 != 0) {
        std::operator<<((ostream *)&std::cout,"[make_fa] A is marked as RIGHT/CYCLIC\n");
      }
    }
    pvVar14 = CFGConnect::group(&this->conn,*(int *)((long)&(ppVar13->value_base_).data_.data_ + 4))
    ;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_150,pvVar14);
    convert_ints_to_symbols(&GroupSyms,this,(vector<int,_std::allocator<int>_> *)&local_150);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_150);
    for (uVar17 = 0;
        (ulong)uVar17 <
        (ulong)((long)GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2); uVar17 = uVar17 + 1) {
      SVar1.x = GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17].x;
      SVar8 = MapSymToState(this,local_220,SVar1);
      iVar16 = SVar1.x >> 1;
      uVar18 = 0;
      while( true ) {
        pvVar3 = (this->g).prods.
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = *(long *)&pvVar3[iVar16].
                          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar3[iVar16].
                                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 2) <=
            (ulong)uVar18) break;
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (&RHS_1,(this->g).rules.
                          super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(int *)(lVar4 + (ulong)uVar18 * 4));
        if (avy::AvyLogFlag == 1) {
          std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",&local_229);
          sVar10 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
          std::__cxx11::string::~string((string *)&RHS);
          if (sVar10 != 0) {
            poVar11 = operator<<((ostream *)&std::cout,&RHS_1);
            std::operator<<(poVar11,"   ");
          }
        }
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_a8,&RHS_1);
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_c0,&GroupSyms);
        bVar6 = intersect_unorder_ord<covenant::Sym>
                          ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_a8,
                           (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_c0);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_c0);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_a8);
        if (bVar6) {
          bVar6 = std::
                  binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                            ((__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                              )GroupSyms.
                               super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                              )GroupSyms.
                               super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                             RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          pSVar5 = RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pSVar2 = RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (bVar6) {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_d8,&GroupSyms
                      );
            bVar6 = intersect_unorder_ord<covenant::Sym>
                              ((iterator)pSVar2,pSVar5 + -1,
                               (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_d8);
            std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                      (&local_d8);
            if (!bVar6) {
              SVar1.x = RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].x;
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&RHS,&RHS_1);
              remove<covenant::Sym>
                        (&RHS,((long)RHS_1.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)RHS_1.
                                     super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) - 1);
              SVar9 = MapSymToState(this,local_220,SVar1);
              std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                        ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_f0,&RHS);
              make_fa(this,SVar8,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_f0,
                      SVar9,local_220);
              std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                        (&local_f0);
              p_Var15 = &RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>;
              goto LAB_001610db;
            }
          }
        }
        else {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_168,&RHS_1);
          p_Var15 = &local_168;
          make_fa(this,SVar8,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)p_Var15,
                  local_224,local_220);
LAB_001610db:
          std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(p_Var15);
        }
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                  (&RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
        uVar18 = uVar18 + 1;
      }
    }
    DFA<covenant::Sym>::eps_transition(&this->dfa,local_228,SVar7);
  }
  else {
    if (uVar12 == 0) {
      if (avy::AvyLogFlag == 1) {
        std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",(allocator *)&GroupSyms);
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
        std::__cxx11::string::~string((string *)&RHS);
        if (sVar10 != 0) {
          std::operator<<((ostream *)&std::cout,"[make_fa] reading epsilon\n");
        }
      }
      DFA<covenant::Sym>::eps_transition(&this->dfa,local_228,local_224);
      return;
    }
    if (uVar12 < 2) goto LAB_00160c29;
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&GroupSyms,alpha);
    remove<covenant::Sym>(&GroupSyms,0);
    SVar7 = DFA<covenant::Sym>::state
                      (&this->dfa,
                       (int)(((long)(this->dfa).trans.
                                    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->dfa).trans.
                                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18));
    RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::push_back
              (&RHS_1,(alpha->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                      _M_impl.super__Vector_impl_data._M_start);
    if (avy::AvyLogFlag == 1) {
      std::__cxx11::string::string((string *)&RHS,"abstraction-mkFA",&local_229);
      sVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)&RHS);
      std::__cxx11::string::~string((string *)&RHS);
      if (sVar10 != 0) {
        poVar11 = std::operator<<((ostream *)&std::cout,"[make_fa] (case A-> BC) reading ");
        poVar11 = operator<<(poVar11,&RHS_1);
        poVar11 = std::operator<<(poVar11," ");
        poVar11 = operator<<(poVar11,&GroupSyms);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
              ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_180,&RHS_1);
    make_fa(this,local_228,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_180,SVar7
            ,local_220);
    std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_180);
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
              ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_198,&GroupSyms);
    make_fa(this,SVar7,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_198,local_224
            ,local_220);
    std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_198);
    std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
              (&RHS_1.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
  }
  p_Var15 = &GroupSyms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>;
LAB_00161122:
  std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(p_Var15);
  return;
}

Assistant:

void make_fa(const State q_0, 
               const vector<EdgeSym> alpha, 
               const State q_1, 
               SymStateMap &SymToState) 
  {

    LOG ("abstraction-mkFA", 
         cout << "reading word " << alpha 
         << " with size " << alpha.size() << endl);

    if (alpha.size() == 0)
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] reading epsilon\n");

      dfa.eps_transition(q_0,q_1);
      return;
    }
    else if (alpha.size () == 1 && alpha[0].isTerm ())
    {

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->a) reading " << alpha << endl);

      dfa.transition(q_0, alpha[0], q_1);
      return;
    }
    else if (alpha.size() >= 2)
    {
      vector<EdgeSym> beta(alpha);
      remove(beta,0);
      State q_2 = dfa.state(dfa.nStates());
      vector<EdgeSym> gamma;
      gamma.push_back(alpha[0]);

      LOG ("abstraction-mkFA",
           cout << "[make_fa] (case A-> BC) reading " << gamma << " " 
           << beta << endl);

      make_fa(q_0, gamma, q_2, SymToState);
      make_fa(q_2, beta , q_1, SymToState);
      return;
    }
    else
    {
      //assert(alpha.size() == 1 && isVar(alpha[0]));

      LOG ("abstraction-mkFA", 
           cout << "[make_fa] (case A->B) reading " << alpha << endl);

      EdgeSym A =  alpha[0];	
      SymSCCMap::iterator It = sym_scc_map.find(A.symID ());
      if (recursive[(*It).second] == NON_REC)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is not recursive\n ");

        for ( unsigned int ri = 0; ri < g.prods[A.symID()].size(); ri++ )
        {
          int r = g.prods[A.symID ()][ri].rule;
          vector<EdgeSym> RHS = g.rules[r];
          make_fa(q_0, RHS, q_1, SymToState);
        }
        return;
      }
        
      State q_A = MapSymToState(SymToState, A);
      if (recursive[(*It).second] == LEFT)
      {

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as LEFT\n");

        // GroupSyms must be sorted
        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];
              
            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_0, RHS, q_C, SymToState);
            else{
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[0]) &&
                  (!intersect_unorder_ord(++RHS.begin(), RHS.end(), GroupSyms)))
              {
                EdgeSym D = RHS[0];
                vector<EdgeSym> beta(RHS);
                remove(beta,0);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_D, beta, q_C, SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_A,q_1);
      } // end LEFT
      else
      {
        /////
        // RIGHT or CYCLIC: code almost identical
        /////

        LOG ("abstraction-mkFA", 
             cout << "[make_fa] A is marked as RIGHT/CYCLIC\n"); 

        vector<EdgeSym> GroupSyms = convert_ints_to_symbols(conn.group((*It).second));
        for (unsigned int gi =0; gi < GroupSyms.size() ; gi ++)
        {
          EdgeSym C = GroupSyms[gi];
          State q_C = MapSymToState(SymToState, C);
          for ( unsigned int ri = 0; ri < g.prods[C.symID ()].size(); ri++ )
          {
            int r = g.prods[C.symID ()][ri].rule;
            vector<EdgeSym> RHS = g.rules[r];

            LOG ("abstraction-mkFA", cout << RHS << "   " );

            if (!intersect_unorder_ord(RHS, GroupSyms))
              make_fa(q_C, RHS, q_1, SymToState);
            else
            {
              if (binary_search(GroupSyms.begin(),GroupSyms.end(), RHS[RHS.size()-1]) &&
                  (!intersect_unorder_ord(RHS.begin(), RHS.end()-1, GroupSyms)))
              {
                EdgeSym D = RHS[RHS.size()-1];
                vector<EdgeSym> beta(RHS);
                remove(beta,RHS.size()-1);
                State q_D = MapSymToState(SymToState, D);
                make_fa(q_C, beta, q_D,  SymToState);
              }		    
            }
          }
        }
        dfa.eps_transition(q_0,q_A);
      } // end RIGHT or CYCLIC	
      return;
    }
  }